

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::GetActualResultType
          (ValidationState_t *_,Instruction *inst,uint32_t *actual_result_type)

{
  pointer puVar1;
  bool bVar2;
  uint uVar3;
  Instruction *pIVar4;
  char *pcVar5;
  DiagnosticStream DStack_1f8;
  
  uVar3 = (inst->inst_).opcode - 0x131;
  if ((uVar3 < 0x10) && ((0x8fffU >> (uVar3 & 0x1f) & 1) != 0)) {
    pIVar4 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar4 == (Instruction *)0x0) {
      __assert_fail("type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x2e9,
                    "spv_result_t spvtools::val::(anonymous namespace)::GetActualResultType(ValidationState_t &, const Instruction *, uint32_t *)"
                   );
    }
    if ((pIVar4->inst_).opcode == 0x1e) {
      puVar1 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 0x10) {
        bVar2 = ValidationState_t::IsIntScalarType(_,puVar1[2]);
        if (bVar2) {
          uVar3 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[3];
          goto LAB_00586579;
        }
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar5 = "Expected Result Type to be a struct containing an int scalar and a texel";
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar5 = "Expected Result Type to be OpTypeStruct";
    }
    std::operator<<((ostream *)&DStack_1f8,pcVar5);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  }
  else {
    uVar3 = (inst->inst_).type_id;
LAB_00586579:
    *actual_result_type = uVar3;
    DStack_1f8.error_ = SPV_SUCCESS;
  }
  return DStack_1f8.error_;
}

Assistant:

spv_result_t GetActualResultType(ValidationState_t& _, const Instruction* inst,
                                 uint32_t* actual_result_type) {
  const spv::Op opcode = inst->opcode();

  if (IsSparse(opcode)) {
    const Instruction* const type_inst = _.FindDef(inst->type_id());
    assert(type_inst);

    if (!type_inst || type_inst->opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be OpTypeStruct";
    }

    if (type_inst->words().size() != 4 ||
        !_.IsIntScalarType(type_inst->word(2))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be a struct containing an int "
                "scalar and a texel";
    }

    *actual_result_type = type_inst->word(3);
  } else {
    *actual_result_type = inst->type_id();
  }

  return SPV_SUCCESS;
}